

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O0

void __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::ClearInstanceData
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this)

{
  TopLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  std::
  unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
  ::clear(&this->m_Instances);
  StringPool::Clear(&this->m_StringPool);
  (this->m_BuildInfo).BindingMode = HIT_GROUP_BINDING_MODE_LAST;
  (this->m_BuildInfo).HitGroupStride = 0;
  (this->m_BuildInfo).FirstContributionToHitGroupIndex = 0xffffffff;
  (this->m_BuildInfo).LastContributionToHitGroupIndex = 0xffffffff;
  return;
}

Assistant:

void ClearInstanceData()
    {
        this->m_Instances.clear();
        this->m_StringPool.Clear();

        this->m_BuildInfo.BindingMode                      = HIT_GROUP_BINDING_MODE_LAST;
        this->m_BuildInfo.HitGroupStride                   = 0;
        this->m_BuildInfo.FirstContributionToHitGroupIndex = INVALID_INDEX;
        this->m_BuildInfo.LastContributionToHitGroupIndex  = INVALID_INDEX;
    }